

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

void Runner_run_case(Runner *runner,Arguments *args,Env *env)

{
  Pointer *vo_00;
  Dimensions dims;
  Dimensions dims_00;
  Dimensions dims_01;
  Dimensions dims_02;
  Dimensions dims_03;
  Dimensions dims_04;
  Dimensions dims_05;
  Dimensions dims_06;
  Dimensions dims_07;
  Dimensions dims_08;
  Dimensions dims_09;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Bool_t BVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  Pointer *vi_00;
  uint uVar15;
  Timer TVar16;
  Timer TVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  Pointer vo;
  Pointer vi;
  Quantities quan;
  Sweeper sweeper;
  Pointer local_340;
  Pointer local_318;
  Quantities local_2f0;
  Sweeper local_278;
  
  Sweeper_null();
  Pointer_null();
  Pointer_null();
  runner->flops = 0.0;
  runner->floprate = 0.0;
  runner->normsq = 0.0;
  runner->normsqdiff = 0.0;
  runner->time = 0.0;
  iVar1 = Arguments_consume_int_or_default(args,"--ncell_x",5);
  iVar2 = Arguments_consume_int_or_default(args,"--ncell_y",5);
  iVar3 = Arguments_consume_int_or_default(args,"--ncell_z",5);
  iVar4 = Arguments_consume_int_or_default(args,"--ne",0x1e);
  iVar5 = Arguments_consume_int_or_default(args,"--na",0x21);
  uVar6 = Arguments_consume_int_or_default(args,"--niterations",1);
  if (iVar1 < 1) {
    insist_("dims_g.ncell_x > 0 ? \"Invalid ncell_x supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x58);
  }
  if (iVar2 < 1) {
    insist_("dims_g.ncell_y > 0 ? \"Invalid ncell_y supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x59);
  }
  if (iVar3 < 1) {
    insist_("dims_g.ncell_z > 0 ? \"Invalid ncell_z supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5a);
  }
  if (iVar4 < 1) {
    insist_("dims_g.ne > 0 ? \"Invalid ne supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5b);
  }
  if (iVar5 < 1) {
    insist_("dims_g.na > 0 ? \"Invalid na supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5d);
  }
  if ((int)uVar6 < 0) {
    insist_("niterations >= 0 ? \"Invalid iteration count supplied.\" : 0",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
            ,0x5e);
  }
  iVar7 = Env_proc_x_this(env);
  iVar8 = Env_nproc_x(env);
  iVar9 = Env_proc_x_this(env);
  iVar10 = Env_nproc_x(env);
  iVar10 = ((iVar7 + 1) * iVar1) / iVar8 - (iVar9 * iVar1) / iVar10;
  iVar1 = Env_proc_y_this(env);
  iVar7 = Env_nproc_y(env);
  iVar8 = Env_proc_y_this(env);
  iVar9 = Env_nproc_y(env);
  iVar1 = ((iVar1 + 1) * iVar2) / iVar7 - (iVar8 * iVar2) / iVar9;
  dims.na = iVar5;
  dims.nm = 0x10;
  dims.ncell_y = iVar1;
  dims.ncell_x = iVar10;
  dims.ne = iVar4;
  dims.ncell_z = iVar3;
  Quantities_create(&local_2f0,dims,env);
  dims_00.na = iVar5;
  dims_00.nm = 0x10;
  dims_00.ncell_y = iVar1;
  dims_00.ncell_x = iVar10;
  dims_00.ne = iVar4;
  dims_00.ncell_z = iVar3;
  sVar12 = Dimensions_size_state(dims_00,4);
  BVar11 = Env_cuda_is_using_device(env);
  Pointer_create(&local_318,sVar12,BVar11);
  Pointer_set_pinned(&local_318,1);
  Pointer_allocate(&local_318);
  dims_01.na = iVar5;
  dims_01.nm = 0x10;
  dims_01.ncell_y = iVar1;
  dims_01.ncell_x = iVar10;
  dims_01.ne = iVar4;
  dims_01.ncell_z = iVar3;
  sVar12 = Dimensions_size_state(dims_01,4);
  BVar11 = Env_cuda_is_using_device(env);
  Pointer_create(&local_340,sVar12,BVar11);
  Pointer_set_pinned(&local_340,1);
  Pointer_allocate(&local_340);
  if ((local_318.h_ != (P *)0x0) &&
     (dims_02.na = iVar5, dims_02.nm = 0x10, dims_02.ncell_y = iVar1, dims_02.ncell_x = iVar10,
     dims_02.ne = iVar4, dims_02.ncell_z = iVar3,
     initialize_state(local_318.h_,dims_02,4,&local_2f0), local_340.h_ != (P *)0x0)) {
    dims_03.na = iVar5;
    dims_03.nm = 0x10;
    dims_03.ncell_y = iVar1;
    dims_03.ncell_x = iVar10;
    dims_03.ne = iVar4;
    dims_03.ncell_z = iVar3;
    initialize_state_zero(local_340.h_,dims_03,4);
    dims_04.na = iVar5;
    dims_04.nm = 0x10;
    dims_04.ncell_y = iVar1;
    dims_04.ncell_x = iVar10;
    dims_04.ne = iVar4;
    dims_04.ncell_z = iVar3;
    Sweeper_create(&local_278,dims_04,&local_2f0,env,args);
    BVar11 = Arguments_are_all_consumed(args);
    if (BVar11 == 0) {
      insist_("Arguments_are_all_consumed( args ) ? \"Invalid argument detected.\" : 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/4_driver/runner.c"
              ,0x8e);
    }
    TVar16 = Env_get_synced_time(env);
    if (0 < (int)uVar6) {
      uVar15 = 0;
      do {
        vi_00 = &local_340;
        vo_00 = &local_318;
        if ((uVar15 & 1) == 0) {
          vi_00 = &local_318;
          vo_00 = &local_340;
        }
        Sweeper_sweep(&local_278,vo_00,vi_00,&local_2f0,env);
        uVar15 = uVar15 + 1;
      } while (uVar6 != uVar15);
    }
    TVar17 = Env_get_synced_time(env);
    runner->time = TVar17 - TVar16;
    dims_05.na = iVar5;
    dims_05.nm = 0x10;
    dims_05.ncell_y = iVar1;
    dims_05.ncell_x = iVar10;
    dims_05.ne = iVar4;
    dims_05.ncell_z = iVar3;
    sVar12 = Dimensions_size_state(dims_05,4);
    lVar13 = sVar12 << 3;
    auVar19._8_4_ = (int)((ulong)lVar13 >> 0x20);
    auVar19._0_8_ = lVar13;
    auVar19._12_4_ = 0x45300000;
    dVar22 = (auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
    dims_06.na = iVar5;
    dims_06.nm = 0x10;
    dims_06.ncell_y = iVar1;
    dims_06.ncell_x = iVar10;
    dims_06.ne = iVar4;
    dims_06.ncell_z = iVar3;
    sVar12 = Dimensions_size_state_angles(dims_06,4);
    auVar20._8_4_ = (int)(sVar12 >> 0x20);
    auVar20._0_8_ = sVar12;
    auVar20._12_4_ = 0x45300000;
    dims_07.na = iVar5;
    dims_07.nm = 0x10;
    dims_07.ncell_y = iVar1;
    dims_07.ncell_x = iVar10;
    dims_07.ne = iVar4;
    dims_07.ncell_z = iVar3;
    dVar18 = Quantities_flops_per_solve(dims_07);
    dims_08.na = iVar5;
    dims_08.nm = 0x10;
    dims_08.ncell_y = iVar1;
    dims_08.ncell_x = iVar10;
    dims_08.ne = iVar4;
    dims_08.ncell_z = iVar3;
    sVar14 = Dimensions_size_state(dims_08,4);
    lVar13 = sVar14 << 3;
    auVar21._8_4_ = (int)((ulong)lVar13 >> 0x20);
    auVar21._0_8_ = lVar13;
    auVar21._12_4_ = 0x45300000;
    dVar23 = (auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
    dVar18 = Env_sum_d(env,((double)iVar5 * (dVar23 + dVar23) +
                           dVar18 * ((auVar20._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)sVar12) - 4503599627370496.0))
                           + (double)iVar5 * (dVar22 + dVar22)) * (double)(int)uVar6);
    runner->flops = dVar18;
    runner->floprate =
         (double)(-(ulong)(0.0 < runner->time) & (ulong)((dVar18 / runner->time) / 1000000000.0));
    if ((local_318.h_ != (P *)0x0) && (local_340.h_ != (P *)0x0)) {
      dims_09.na = iVar5;
      dims_09.nm = 0x10;
      dims_09.ncell_y = iVar1;
      dims_09.ncell_x = iVar10;
      dims_09.ne = iVar4;
      dims_09.ncell_z = iVar3;
      get_state_norms(local_318.h_,local_340.h_,dims_09,4,&runner->normsq,&runner->normsqdiff,env);
      Pointer_destroy(&local_318);
      Pointer_destroy(&local_340);
      Sweeper_destroy(&local_278,env);
      Quantities_destroy(&local_2f0);
      return;
    }
  }
  __assert_fail("p->h_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/1_base/pointer_kernels.h"
                ,0x31,"P *restrict Pointer_h(Pointer *)");
}

Assistant:

void Runner_run_case( Runner* runner, Arguments* args, Env* env )
{
  /*---Declarations---*/

  Dimensions  dims_g;       /*---dims for entire problem---*/
  Dimensions  dims;         /*---dims for the part on this MPI proc---*/
  Quantities  quan;
  Sweeper     sweeper = Sweeper_null();

  Pointer vi = Pointer_null();
  Pointer vo = Pointer_null();

  runner->normsq     = P_zero();
  runner->normsqdiff = P_zero();

  int iteration   = 0;
  int niterations = 0;

  Timer t1             = 0;
  Timer t2             = 0;

  runner->time       = 0;
  runner->flops      = 0;
  runner->floprate   = 0;
  runner->normsq     = 0;
  runner->normsqdiff = 0;

  /*---Define problem specs---*/

  dims_g.ncell_x = Arguments_consume_int_or_default( args, "--ncell_x",  5 );
  dims_g.ncell_y = Arguments_consume_int_or_default( args, "--ncell_y",  5 );
  dims_g.ncell_z = Arguments_consume_int_or_default( args, "--ncell_z",  5 );
  dims_g.ne   = Arguments_consume_int_or_default( args, "--ne", 30 );
  dims_g.na   = Arguments_consume_int_or_default( args, "--na", 33 );
  niterations = Arguments_consume_int_or_default( args, "--niterations", 1 );
  dims_g.nm   = NM;

  Insist( dims_g.ncell_x > 0 ? "Invalid ncell_x supplied." : 0 );
  Insist( dims_g.ncell_y > 0 ? "Invalid ncell_y supplied." : 0 );
  Insist( dims_g.ncell_z > 0 ? "Invalid ncell_z supplied." : 0 );
  Insist( dims_g.ne > 0      ? "Invalid ne supplied." : 0 );
  Insist( dims_g.nm > 0      ? "Invalid nm supplied." : 0 );
  Insist( dims_g.na > 0      ? "Invalid na supplied." : 0 );
  Insist( niterations >= 0   ? "Invalid iteration count supplied." : 0 );

  /*---Initialize (local) dimensions - domain decomposition---*/

  dims = dims_g;

  dims.ncell_x =
      ( ( Env_proc_x_this( env ) + 1 ) * dims_g.ncell_x ) / Env_nproc_x( env )
    - ( ( Env_proc_x_this( env )     ) * dims_g.ncell_x ) / Env_nproc_x( env );

  dims.ncell_y =
      ( ( Env_proc_y_this( env ) + 1 ) * dims_g.ncell_y ) / Env_nproc_y( env )
    - ( ( Env_proc_y_this( env )     ) * dims_g.ncell_y ) / Env_nproc_y( env );

  /*---Initialize quantities---*/

  Quantities_create( &quan, dims, env );

  /*---Allocate arrays---*/

  Pointer_create( &vi, Dimensions_size_state( dims, NU ),
                                            Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( &vi, Bool_true );
  Pointer_allocate( &vi );

  Pointer_create( &vo, Dimensions_size_state( dims, NU ),
                                            Env_cuda_is_using_device( env ) );
  Pointer_set_pinned( &vo, Bool_true );
  Pointer_allocate( &vo );

  /*---Initialize input state array---*/

  initialize_state( Pointer_h( &vi ), dims, NU, &quan );

  /*---Initialize output state array---*/
  /*---This is not strictly required for the output vector but might
       have a performance effect from pre-touching pages.
  ---*/

  initialize_state_zero( Pointer_h( &vo ), dims, NU );

  /*---Initialize sweeper---*/

  Sweeper_create( &sweeper, dims, &quan, env, args );

  /*---Check that all command line args used---*/

  Insist( Arguments_are_all_consumed( args )
                                          ? "Invalid argument detected." : 0 );

  /*---Call sweeper---*/

  t1 = Env_get_synced_time( env );

  for( iteration=0; iteration<niterations; ++iteration )
  {
    Sweeper_sweep( &sweeper,
                   iteration%2==0 ? &vo : &vi,
                   iteration%2==0 ? &vi : &vo,
                   &quan,
                   env );
  }

  t2 = Env_get_synced_time( env );
  runner->time = t2 - t1;

  /*---Compute flops used---*/

  runner->flops = Env_sum_d( env, niterations *
         ( Dimensions_size_state( dims, NU ) * NOCTANT * 2. * dims.na
         + Dimensions_size_state_angles( dims, NU )
                                        * Quantities_flops_per_solve( dims )
         + Dimensions_size_state( dims, NU ) * NOCTANT * 2. * dims.na ) );

  runner->floprate = runner->time <= (Timer)0 ?
                                   0 : runner->flops / runner->time / 1e9;

  /*---Compute, print norm squared of result---*/

  get_state_norms( Pointer_h( &vi ), Pointer_h( &vo ),
                     dims, NU, &runner->normsq, &runner->normsqdiff, env );

  /*---Deallocations---*/
  Pointer_destroy( &vi );
  Pointer_destroy( &vo );

  Sweeper_destroy( &sweeper, env );
  Quantities_destroy( &quan );
}